

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryBuilder::readNames(WasmBinaryBuilder *this,size_t payloadLen)

{
  pointer puVar1;
  __uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true> _Var2;
  Module *pMVar3;
  pointer puVar4;
  __uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true> _Var5;
  pointer puVar6;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var7;
  pointer puVar8;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var9;
  pointer puVar10;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var11;
  pointer puVar12;
  __uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true> _Var13;
  __uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
  _Var14;
  pointer pHVar15;
  pointer puVar16;
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> _Var17;
  char cVar18;
  bool bVar19;
  char cVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  ostream *poVar23;
  size_t sVar24;
  __node_base_ptr p_Var25;
  mapped_type *pmVar26;
  mapped_type *pmVar27;
  uint uVar28;
  ulong uVar29;
  pointer puVar30;
  ulong uVar31;
  Name NVar32;
  Name NVar33;
  string_view sVar34;
  string local_168;
  string local_148;
  __node_base_ptr local_128;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_120;
  ulong local_118;
  ulong local_110;
  long *local_108;
  long local_100;
  long local_f8 [2];
  size_t local_e8;
  ulong local_e0;
  size_t local_d8;
  ulong local_d0;
  __node_base_ptr local_c8;
  uint32_t local_bc;
  undefined1 auStack_b8 [4];
  uint32_t localIndex;
  NameProcessor processor;
  long *local_78;
  uint32_t fieldIndex;
  undefined4 uStack_6c;
  long local_68 [2];
  WasmBinaryBuilder *local_58;
  size_type *local_50;
  string __str;
  
  local_d8 = payloadLen;
  bVar19 = isDebugEnabled("binary");
  if (bVar19) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"== readNames\n",0xd);
  }
  local_d8 = local_d8 + this->pos;
  local_d0 = 0;
  local_58 = this;
  do {
    if (local_d8 <= this->pos) {
      if (this->pos != local_d8) {
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"bad names section position change","");
        throwError(this,&local_148);
      }
      return;
    }
    uVar21 = getU32LEB(this);
    if (uVar21 <= (uint)local_d0 && (uint)local_d0 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: out-of-order name subsection: ",0x27);
      poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
      std::ostream::put((char)poVar23);
      std::ostream::flush();
    }
    local_d0 = (ulong)uVar21;
    uVar22 = getU32LEB(this);
    local_e8 = this->pos;
    local_e0 = (ulong)uVar22;
    switch(uVar21) {
    case 0:
      sVar34 = (string_view)getInlineString(this);
      (this->wasm->name).super_IString.str = sVar34;
      goto LAB_00975f3e;
    case 1:
      uVar21 = getU32LEB(this);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar21 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          uVar21 = getU32LEB(this);
          NVar32 = getInlineString(this);
          NVar33 = escape(NVar32);
          NVar33 = NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33);
          puVar10 = (local_58->wasm->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar21 <
              (ulong)((long)(local_58->wasm->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3)) {
            _Var11.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
                 puVar10[uVar21]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
            *(IString *)
             _Var11.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
             .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = NVar33.super_IString.str;
            *(undefined1 *)
             ((long)_Var11.
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10) = 1;
            this = local_58;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: function index out of bounds in name section, function subsection: "
                       ,0x4c);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar32.super_IString.str._M_str,
                       NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
            cVar20 = '\x01';
            if (9 < uVar21) {
              uVar22 = uVar21;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar22 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_00975726;
                }
                if (uVar22 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_00975726;
                }
                if (uVar22 < 10000) goto LAB_00975726;
                bVar19 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_00975726:
            local_50 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_50,(uint)__str._M_dataplus._M_p,uVar21);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar23,(char *)local_50,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            this = local_58;
            if (local_50 != &__str._M_string_length) {
              operator_delete(local_50,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
        } while (p_Var25 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 2:
      uVar21 = getU32LEB(this);
      if (uVar21 != 0) {
        local_110 = (ulong)uVar21;
        uVar29 = 0;
        do {
          local_118 = uVar29;
          uVar21 = getU32LEB(this);
          puVar10 = (this->wasm->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar21 <
              (ulong)((long)(this->wasm->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3)) {
            processor.usedNames._M_h._M_single_bucket =
                 *(__node_base_ptr *)
                  &puVar10[uVar21]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: function index out of bounds in name section, local subsection: ",
                       0x49);
            cVar20 = '\x01';
            if (9 < uVar21) {
              uVar22 = uVar21;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar22 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_009750b9;
                }
                if (uVar22 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_009750b9;
                }
                if (uVar22 < 10000) goto LAB_009750b9;
                bVar19 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_009750b9:
            _auStack_b8 = &processor.usedNames._M_h._M_bucket_count;
            std::__cxx11::string::_M_construct((ulong)auStack_b8,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)_auStack_b8,(uint)processor.usedNames._M_h._M_buckets,uVar21);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)_auStack_b8,
                                 (long)processor.usedNames._M_h._M_buckets);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            if (_auStack_b8 != &processor.usedNames._M_h._M_bucket_count) {
              operator_delete(_auStack_b8,processor.usedNames._M_h._M_bucket_count + 1);
            }
            processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
          }
          uVar21 = getU32LEB(this);
          _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
          processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
          processor.usedNames._M_h._M_bucket_count = 0;
          processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
          processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
          processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
          if (uVar21 != 0) {
            local_128 = (__node_base_ptr)(ulong)uVar21;
            local_120 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(processor.usedNames._M_h._M_single_bucket + 0xe);
            p_Var25 = (__node_base_ptr)0x0;
            do {
              local_bc = getU32LEB(this);
              NVar32 = getInlineString(this);
              if (processor.usedNames._M_h._M_single_bucket != (__node_base_ptr)0x0) {
                local_c8 = p_Var25;
                NVar33 = escape(NVar32);
                sVar34 = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33)
                ;
                if (sVar34._M_len == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"warning: empty local name at index ",0x23);
                  this = local_58;
                  uVar21 = local_bc;
                  cVar20 = '\x01';
                  if (9 < local_bc) {
                    uVar22 = local_bc;
                    cVar18 = '\x04';
                    do {
                      cVar20 = cVar18;
                      if (uVar22 < 100) {
                        cVar20 = cVar20 + -2;
                        goto LAB_0097539d;
                      }
                      if (uVar22 < 1000) {
                        cVar20 = cVar20 + -1;
                        goto LAB_0097539d;
                      }
                      if (uVar22 < 10000) goto LAB_0097539d;
                      bVar19 = 99999 < uVar22;
                      uVar22 = uVar22 / 10000;
                      cVar18 = cVar20 + '\x04';
                    } while (bVar19);
                    cVar20 = cVar20 + '\x01';
                  }
LAB_0097539d:
                  local_78 = local_68;
                  std::__cxx11::string::_M_construct((ulong)&local_78,cVar20);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)local_78,fieldIndex,uVar21);
                  poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,(char *)local_78,
                                       CONCAT44(uStack_6c,fieldIndex));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar23," in function ",0xd);
                  local_50 = &__str._M_string_length;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_50,processor.usedNames._M_h._M_single_bucket[1]._M_nxt
                             ,(long)&(processor.usedNames._M_h._M_single_bucket[1]._M_nxt)->_M_nxt +
                              (long)&(processor.usedNames._M_h._M_single_bucket)->_M_nxt->_M_nxt);
                  poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar23,(char *)local_50,
                                       CONCAT44(__str._M_dataplus._M_p._4_4_,
                                                (uint)__str._M_dataplus._M_p));
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
                  std::ostream::put((char)poVar23);
                  std::ostream::flush();
                  if (local_50 != &__str._M_string_length) {
                    operator_delete(local_50,__str._M_string_length + 1);
                  }
                  p_Var25 = local_c8;
                  if (local_78 != local_68) {
LAB_00975472:
                    operator_delete(local_78,local_68[0] + 1);
                  }
                }
                else {
                  uVar29 = (ulong)local_bc;
                  sVar24 = Function::getNumLocals
                                     ((Function *)processor.usedNames._M_h._M_single_bucket);
                  if (uVar29 < sVar24) {
                    pmVar27 = std::__detail::
                              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[](local_120,&local_bc);
                    (pmVar27->super_IString).str = sVar34;
                    this = local_58;
                    p_Var25 = local_c8;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               "warning: local index out of bounds in name section, local subsection: "
                               ,0x46);
                    local_78 = local_68;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_78,NVar32.super_IString.str._M_str,
                               NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
                    poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr,(char *)local_78,
                                         CONCAT44(uStack_6c,fieldIndex));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
                    this = local_58;
                    uVar21 = local_bc;
                    p_Var25 = local_c8;
                    cVar20 = '\x01';
                    if (9 < local_bc) {
                      uVar22 = local_bc;
                      cVar18 = '\x04';
                      do {
                        cVar20 = cVar18;
                        if (uVar22 < 100) {
                          cVar20 = cVar20 + -2;
                          goto LAB_0097549a;
                        }
                        if (uVar22 < 1000) {
                          cVar20 = cVar20 + -1;
                          goto LAB_0097549a;
                        }
                        if (uVar22 < 10000) goto LAB_0097549a;
                        bVar19 = 99999 < uVar22;
                        uVar22 = uVar22 / 10000;
                        cVar18 = cVar20 + '\x04';
                      } while (bVar19);
                      cVar20 = cVar20 + '\x01';
                    }
LAB_0097549a:
                    local_50 = &__str._M_string_length;
                    std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
                    std::__detail::__to_chars_10_impl<unsigned_int>
                              ((char *)local_50,(uint)__str._M_dataplus._M_p,uVar21);
                    poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar23,(char *)local_50,
                                         CONCAT44(__str._M_dataplus._M_p._4_4_,
                                                  (uint)__str._M_dataplus._M_p));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar23," in function ",0xd);
                    local_108 = local_f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_108,
                               processor.usedNames._M_h._M_single_bucket[1]._M_nxt,
                               (long)&(processor.usedNames._M_h._M_single_bucket[1]._M_nxt)->_M_nxt
                               + (long)&(processor.usedNames._M_h._M_single_bucket)->_M_nxt->_M_nxt)
                    ;
                    poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar23,(char *)local_108,local_100);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23)
                    ;
                    std::ostream::put((char)poVar23);
                    std::ostream::flush();
                    if (local_108 != local_f8) {
                      operator_delete(local_108,local_f8[0] + 1);
                    }
                    if (local_50 != &__str._M_string_length) {
                      operator_delete(local_50,__str._M_string_length + 1);
                    }
                    if (local_78 != local_68) goto LAB_00975472;
                  }
                }
              }
              p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
            } while (p_Var25 != local_128);
          }
          std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)auStack_b8);
          uVar29 = local_118 + 1;
        } while (uVar29 != local_110);
      }
      goto LAB_00975f3e;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: unknown name subsection with id ",0x29);
      cVar20 = '\x01';
      if (9 < uVar21) {
        uVar29 = local_d0;
        cVar18 = '\x04';
        do {
          cVar20 = cVar18;
          uVar28 = (uint)uVar29;
          if (uVar28 < 100) {
            cVar20 = cVar20 + -2;
            goto LAB_00975fc8;
          }
          if (uVar28 < 1000) {
            cVar20 = cVar20 + -1;
            goto LAB_00975fc8;
          }
          if (uVar28 < 10000) goto LAB_00975fc8;
          uVar29 = (uVar29 & 0xffffffff) / 10000;
          cVar18 = cVar20 + '\x04';
        } while (99999 < uVar28);
        cVar20 = cVar20 + '\x01';
      }
LAB_00975fc8:
      _auStack_b8 = &processor.usedNames._M_h._M_bucket_count;
      std::__cxx11::string::_M_construct((ulong)auStack_b8,cVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)_auStack_b8,(uint)processor.usedNames._M_h._M_buckets,(uint)local_d0);
      poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)_auStack_b8,
                           (long)processor.usedNames._M_h._M_buckets);
      std::__ostream_insert<char,std::char_traits<char>>(poVar23," at ",4);
      poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
      std::ostream::put((char)poVar23);
      std::ostream::flush();
      if (_auStack_b8 != &processor.usedNames._M_h._M_bucket_count) {
        operator_delete(_auStack_b8,processor.usedNames._M_h._M_bucket_count + 1);
      }
      this->pos = local_e8 + local_e0;
      goto LAB_00975f3e;
    case 4:
      uVar21 = getU32LEB(this);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar21 != 0) {
        local_c8 = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          uVar21 = getU32LEB(this);
          processor.usedNames._M_h._M_single_bucket =
               (__node_base_ptr)CONCAT44(processor.usedNames._M_h._M_single_bucket._4_4_,uVar21);
          NVar32 = getInlineString(this);
          NVar33 = escape(NVar32);
          sVar34 = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33);
          pHVar15 = (local_58->types).
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((ulong)processor.usedNames._M_h._M_single_bucket & 0xffffffff) <
              (ulong)((long)(local_58->types).
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >> 3)) {
            pmVar26 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_58->wasm->typeNames,
                                   pHVar15 + ((ulong)processor.usedNames._M_h._M_single_bucket &
                                             0xffffffff));
            (pmVar26->name).super_IString.str = sVar34;
            this = local_58;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: type index out of bounds in name section, type subsection: ",0x44);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar32.super_IString.str._M_str,
                       NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            this = local_58;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
            cVar20 = '\x01';
            if (9 < (uint)processor.usedNames._M_h._M_single_bucket) {
              uVar28 = (uint)processor.usedNames._M_h._M_single_bucket;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar28 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_00974f58;
                }
                if (uVar28 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_00974f58;
                }
                if (uVar28 < 10000) goto LAB_00974f58;
                bVar19 = 99999 < uVar28;
                uVar28 = uVar28 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_00974f58:
            local_50 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_50,(uint)__str._M_dataplus._M_p,
                       (uint)processor.usedNames._M_h._M_single_bucket);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar23,(char *)local_50,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            if (local_50 != &__str._M_string_length) {
              operator_delete(local_50,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
        } while (p_Var25 != local_c8);
      }
      break;
    case 5:
      uVar21 = getU32LEB(this);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar21 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          uVar21 = getU32LEB(this);
          NVar32 = getInlineString(this);
          NVar33 = escape(NVar32);
          NVar33 = NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33);
          pMVar3 = local_58->wasm;
          puVar4 = (pMVar3->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar21 <
              (ulong)((long)(pMVar3->tables).
                            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3)) {
            _Var5.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
                 puVar4[uVar21]._M_t.
                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>;
            puVar6 = (pMVar3->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar30 = (pMVar3->elementSegments).
                           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar6;
                puVar30 = puVar30 + 1) {
              _Var7._M_head_impl =
                   (puVar30->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
              if (*(char **)((long)&(_Var7._M_head_impl)->table + 8) ==
                  *(char **)((long)_Var5.
                                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                   .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 8)) {
                ((_Var7._M_head_impl)->table).super_IString = NVar33.super_IString.str;
              }
            }
            *(IString *)
             _Var5.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl = NVar33.super_IString.str;
            *(undefined1 *)
             ((long)_Var5.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                    super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x10) = 1;
            this = local_58;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: table index out of bounds in name section, table subsection: ",0x46
                      );
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar32.super_IString.str._M_str,
                       NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            this = local_58;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
            cVar20 = '\x01';
            if (9 < uVar21) {
              uVar22 = uVar21;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar22 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_00974b31;
                }
                if (uVar22 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_00974b31;
                }
                if (uVar22 < 10000) goto LAB_00974b31;
                bVar19 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_00974b31:
            local_50 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_50,(uint)__str._M_dataplus._M_p,uVar21);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar23,(char *)local_50,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            if (local_50 != &__str._M_string_length) {
              operator_delete(local_50,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
        } while (p_Var25 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 6:
      uVar21 = getU32LEB(this);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar21 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          uVar21 = getU32LEB(this);
          NVar32 = getInlineString(this);
          NVar33 = escape(NVar32);
          NVar33 = NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33);
          puVar8 = (local_58->wasm->memories).
                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar21 <
              (ulong)((long)(local_58->wasm->memories).
                            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3)) {
            _Var9.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
                 puVar8[uVar21]._M_t.
                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
            *(IString *)
             _Var9.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = NVar33.super_IString.str;
            *(undefined1 *)
             ((long)_Var9.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x10) = 1;
            this = local_58;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: memory index out of bounds in name section, memory subsection: ",
                       0x48);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar32.super_IString.str._M_str,
                       NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            this = local_58;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
            cVar20 = '\x01';
            if (9 < uVar21) {
              uVar22 = uVar21;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar22 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_00974d3a;
                }
                if (uVar22 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_00974d3a;
                }
                if (uVar22 < 10000) goto LAB_00974d3a;
                bVar19 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_00974d3a:
            local_50 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_50,(uint)__str._M_dataplus._M_p,uVar21);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar23,(char *)local_50,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            if (local_50 != &__str._M_string_length) {
              operator_delete(local_50,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
        } while (p_Var25 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 7:
      uVar21 = getU32LEB(this);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar21 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          uVar21 = getU32LEB(this);
          NVar32 = getInlineString(this);
          NVar33 = escape(NVar32);
          NVar33 = NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33);
          puVar12 = (local_58->wasm->globals).
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar21 <
              (ulong)((long)(local_58->wasm->globals).
                            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3)) {
            _Var13.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
                 puVar12[uVar21]._M_t.
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>;
            *(IString *)
             _Var13.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = NVar33.super_IString.str;
            *(undefined1 *)
             ((long)_Var13.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x10) = 1;
            this = local_58;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: global index out of bounds in name section, global subsection: ",
                       0x48);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar32.super_IString.str._M_str,
                       NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            this = local_58;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
            cVar20 = '\x01';
            if (9 < uVar21) {
              uVar22 = uVar21;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar22 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_00975930;
                }
                if (uVar22 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_00975930;
                }
                if (uVar22 < 10000) goto LAB_00975930;
                bVar19 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_00975930:
            local_50 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_50,(uint)__str._M_dataplus._M_p,uVar21);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar23,(char *)local_50,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            if (local_50 != &__str._M_string_length) {
              operator_delete(local_50,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
        } while (p_Var25 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 8:
      uVar21 = getU32LEB(this);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar21 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          uVar21 = getU32LEB(this);
          NVar32 = getInlineString(this);
          NVar33 = escape(NVar32);
          NVar33 = NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33);
          puVar30 = (local_58->wasm->elementSegments).
                    super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar21 <
              (ulong)((long)(local_58->wasm->elementSegments).
                            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar30 >> 3)) {
            _Var14.
            super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
            _M_t.
            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
                 puVar30[uVar21]._M_t.
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
            ;
            *(IString *)
             _Var14.
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
                 NVar33.super_IString.str;
            *(undefined1 *)
             ((long)_Var14.
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x10) = 1;
            this = local_58;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: elem index out of bounds in name section, elem subsection: ",0x44);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar32.super_IString.str._M_str,
                       NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            this = local_58;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
            cVar20 = '\x01';
            if (9 < uVar21) {
              uVar22 = uVar21;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar22 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_00975b36;
                }
                if (uVar22 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_00975b36;
                }
                if (uVar22 < 10000) goto LAB_00975b36;
                bVar19 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_00975b36:
            local_50 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_50,(uint)__str._M_dataplus._M_p,uVar21);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar23,(char *)local_50,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            if (local_50 != &__str._M_string_length) {
              operator_delete(local_50,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
        } while (p_Var25 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 9:
      uVar21 = getU32LEB(this);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar21 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          uVar21 = getU32LEB(this);
          NVar32 = getInlineString(this);
          NVar33 = escape(NVar32);
          NVar33 = NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33);
          puVar16 = (local_58->wasm->dataSegments).
                    super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar21 <
              (ulong)((long)(local_58->wasm->dataSegments).
                            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar16 >> 3)) {
            _Var17.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
                 puVar16[(long)p_Var25]._M_t.
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>;
            *(IString *)
             _Var17.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
                 NVar33.super_IString.str;
            *(undefined1 *)
             ((long)_Var17.
                    super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                    .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x10) = 1;
            this = local_58;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: data index out of bounds in name section, data subsection: ",0x44);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar32.super_IString.str._M_str,
                       NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            this = local_58;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
            cVar20 = '\x01';
            if (9 < uVar21) {
              uVar22 = uVar21;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar22 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_00975e95;
                }
                if (uVar22 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_00975e95;
                }
                if (uVar22 < 10000) goto LAB_00975e95;
                bVar19 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_00975e95:
            local_50 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_50,(uint)__str._M_dataplus._M_p,uVar21);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar23,(char *)local_50,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            if (local_50 != &__str._M_string_length) {
              operator_delete(local_50,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
        } while (p_Var25 != processor.usedNames._M_h._M_single_bucket);
      }
      break;
    case 10:
      uVar21 = getU32LEB(this);
      if (uVar21 != 0) {
        local_c8 = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          processor.usedNames._M_h._M_single_bucket = p_Var25;
          uVar21 = getU32LEB(this);
          uVar29 = (ulong)uVar21;
          pHVar15 = (this->types).
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (uVar29 < (ulong)((long)(this->types).
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >> 3
                              )) {
            bVar19 = HeapType::isStruct(pHVar15 + uVar29);
          }
          else {
            bVar19 = false;
          }
          if (bVar19 == false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"warning: invalid field index in name field section\n",
                       0x33);
          }
          uVar21 = getU32LEB(this);
          _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
          processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
          processor.usedNames._M_h._M_bucket_count = 0;
          processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
          processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
          processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
          if (uVar21 != 0) {
            uVar31 = (ulong)uVar21;
            do {
              uVar21 = getU32LEB(this);
              local_78 = (long *)CONCAT44(local_78._4_4_,uVar21);
              NVar32 = getInlineString(this);
              NVar32 = escape(NVar32);
              sVar34 = (string_view)NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar32);
              if (bVar19 != false) {
                pmVar26 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&local_58->wasm->typeNames,
                                       (local_58->types).
                                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar29);
                pmVar27 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&pmVar26->fieldNames,(key_type *)&local_78);
                (pmVar27->super_IString).str = sVar34;
              }
              uVar31 = uVar31 - 1;
              this = local_58;
            } while (uVar31 != 0);
          }
          std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)auStack_b8);
          p_Var25 = (__node_base_ptr)
                    ((long)&(processor.usedNames._M_h._M_single_bucket)->_M_nxt + 1);
        } while (p_Var25 != local_c8);
      }
      goto LAB_00975f3e;
    case 0xb:
      uVar21 = getU32LEB(this);
      _auStack_b8 = &processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      if (uVar21 != 0) {
        processor.usedNames._M_h._M_single_bucket = (__node_base_ptr)(ulong)uVar21;
        p_Var25 = (__node_base_ptr)0x0;
        do {
          uVar21 = getU32LEB(this);
          NVar32 = getInlineString(this);
          NVar33 = escape(NVar32);
          NVar33 = NameProcessor::deduplicate((NameProcessor *)auStack_b8,NVar33);
          puVar1 = (local_58->wasm->tags).
                   super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)uVar21 <
              (ulong)((long)(local_58->wasm->tags).
                            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
            _Var2.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
                 puVar1[uVar21]._M_t.
                 super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>;
            *(IString *)
             _Var2.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = NVar33.super_IString.str;
            *(undefined1 *)
             ((long)_Var2.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x10) = 1;
            this = local_58;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: tag index out of bounds in name section, tag subsection: ",0x42);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,NVar32.super_IString.str._M_str,
                       NVar32.super_IString.str._M_str + NVar32.super_IString.str._M_len);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_78,
                                 CONCAT44(uStack_6c,fieldIndex));
            this = local_58;
            std::__ostream_insert<char,std::char_traits<char>>(poVar23," at index ",10);
            cVar20 = '\x01';
            if (9 < uVar21) {
              uVar22 = uVar21;
              cVar18 = '\x04';
              do {
                cVar20 = cVar18;
                if (uVar22 < 100) {
                  cVar20 = cVar20 + -2;
                  goto LAB_009748fa;
                }
                if (uVar22 < 1000) {
                  cVar20 = cVar20 + -1;
                  goto LAB_009748fa;
                }
                if (uVar22 < 10000) goto LAB_009748fa;
                bVar19 = 99999 < uVar22;
                uVar22 = uVar22 / 10000;
                cVar18 = cVar20 + '\x04';
              } while (bVar19);
              cVar20 = cVar20 + '\x01';
            }
LAB_009748fa:
            local_50 = &__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&local_50,cVar20);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_50,(uint)__str._M_dataplus._M_p,uVar21);
            poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar23,(char *)local_50,
                                 CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p)
                                );
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar23 + -0x18) + (char)poVar23);
            std::ostream::put((char)poVar23);
            std::ostream::flush();
            if (local_50 != &__str._M_string_length) {
              operator_delete(local_50,__str._M_string_length + 1);
            }
            if (local_78 != local_68) {
              operator_delete(local_78,local_68[0] + 1);
            }
          }
          p_Var25 = (__node_base_ptr)((long)&p_Var25->_M_nxt + 1);
        } while (p_Var25 != processor.usedNames._M_h._M_single_bucket);
      }
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_b8);
LAB_00975f3e:
    if (this->pos != local_e8 + local_e0) {
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"bad names subsection position change","");
      throwError(this,&local_168);
    }
  } while( true );
}

Assistant:

void WasmBinaryBuilder::readNames(size_t payloadLen) {
  BYN_TRACE("== readNames\n");
  auto sectionPos = pos;
  uint32_t lastType = 0;
  while (pos < sectionPos + payloadLen) {
    auto nameType = getU32LEB();
    if (lastType && nameType <= lastType) {
      std::cerr << "warning: out-of-order name subsection: " << nameType
                << std::endl;
    }
    lastType = nameType;
    auto subsectionSize = getU32LEB();
    auto subsectionPos = pos;
    using Subsection = BinaryConsts::CustomSections::Subsection;
    if (nameType == Subsection::NameModule) {
      wasm.name = getInlineString();
    } else if (nameType == Subsection::NameFunction) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.functions.size()) {
          wasm.functions[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: function index out of bounds in name section, "
                       "function subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameLocal) {
      auto numFuncs = getU32LEB();
      for (size_t i = 0; i < numFuncs; i++) {
        auto funcIndex = getU32LEB();
        Function* func = nullptr;
        if (funcIndex < wasm.functions.size()) {
          func = wasm.functions[funcIndex].get();
        } else {
          std::cerr
            << "warning: function index out of bounds in name section, local "
               "subsection: "
            << std::to_string(funcIndex) << std::endl;
        }
        auto numLocals = getU32LEB();
        NameProcessor processor;
        for (size_t j = 0; j < numLocals; j++) {
          auto localIndex = getU32LEB();
          auto rawLocalName = getInlineString();
          if (!func) {
            continue; // read and discard in case of prior error
          }
          auto localName = processor.process(rawLocalName);
          if (localName.size() == 0) {
            std::cerr << "warning: empty local name at index "
                      << std::to_string(localIndex) << " in function "
                      << std::string(func->name.str) << std::endl;
          } else if (localIndex < func->getNumLocals()) {
            func->localNames[localIndex] = localName;
          } else {
            std::cerr << "warning: local index out of bounds in name "
                         "section, local subsection: "
                      << std::string(rawLocalName.str) << " at index "
                      << std::to_string(localIndex) << " in function "
                      << std::string(func->name.str) << std::endl;
          }
        }
      }
    } else if (nameType == Subsection::NameType) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < types.size()) {
          wasm.typeNames[types[index]].name = name;
        } else {
          std::cerr << "warning: type index out of bounds in name section, "
                       "type subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameTable) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);

        if (index < wasm.tables.size()) {
          auto* table = wasm.tables[index].get();
          for (auto& segment : wasm.elementSegments) {
            if (segment->table == table->name) {
              segment->table = name;
            }
          }
          table->setExplicitName(name);
        } else {
          std::cerr << "warning: table index out of bounds in name section, "
                       "table subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameElem) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);

        if (index < wasm.elementSegments.size()) {
          wasm.elementSegments[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: elem index out of bounds in name section, "
                       "elem subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameMemory) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.memories.size()) {
          wasm.memories[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: memory index out of bounds in name section, "
                       "memory subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameData) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.dataSegments.size()) {
          wasm.dataSegments[i]->setExplicitName(name);
        } else {
          std::cerr << "warning: data index out of bounds in name section, "
                       "data subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameGlobal) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.globals.size()) {
          wasm.globals[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: global index out of bounds in name section, "
                       "global subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameField) {
      auto numTypes = getU32LEB();
      for (size_t i = 0; i < numTypes; i++) {
        auto typeIndex = getU32LEB();
        bool validType =
          typeIndex < types.size() && types[typeIndex].isStruct();
        if (!validType) {
          std::cerr << "warning: invalid field index in name field section\n";
        }
        auto numFields = getU32LEB();
        NameProcessor processor;
        for (size_t i = 0; i < numFields; i++) {
          auto fieldIndex = getU32LEB();
          auto rawName = getInlineString();
          auto name = processor.process(rawName);
          if (validType) {
            wasm.typeNames[types[typeIndex]].fieldNames[fieldIndex] = name;
          }
        }
      }
    } else if (nameType == Subsection::NameTag) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.tags.size()) {
          wasm.tags[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: tag index out of bounds in name section, "
                       "tag subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else {
      std::cerr << "warning: unknown name subsection with id "
                << std::to_string(nameType) << " at " << pos << std::endl;
      pos = subsectionPos + subsectionSize;
    }
    if (pos != subsectionPos + subsectionSize) {
      throwError("bad names subsection position change");
    }
  }
  if (pos != sectionPos + payloadLen) {
    throwError("bad names section position change");
  }
}